

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

void SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>
               (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                *list,char *szName,Base *value,bool *bWasExisting)

{
  bool *pbVar1;
  char *this;
  bool bVar2;
  reference ppVar3;
  pair<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*> local_50;
  _Self local_40;
  _Self local_38;
  iterator it;
  uint32_t hash;
  bool *bWasExisting_local;
  Base *value_local;
  char *szName_local;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list_local;
  
  bWasExisting_local = (bool *)value;
  value_local = (Base *)szName;
  szName_local = (char *)list;
  if (szName != (char *)0x0) {
    it._M_node._4_4_ = SuperFastHash(szName,0,0);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
         ::find((map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                 *)szName_local,(key_type *)((long)&it._M_node + 4));
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
         ::end((map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                *)szName_local);
    bVar2 = std::operator==(&local_38,&local_40);
    this = szName_local;
    if (bVar2) {
      if (bWasExisting != (bool *)0x0) {
        *bWasExisting = false;
      }
      std::pair<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>::
      pair<Assimp::SharedPostProcessInfo::Base_*&,_true>
                (&local_50,(uint *)((long)&it._M_node + 4),(Base **)&bWasExisting_local);
      std::
      map<unsigned_int,Assimp::SharedPostProcessInfo::Base*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
      ::insert<std::pair<unsigned_int,Assimp::SharedPostProcessInfo::Base*>>
                ((map<unsigned_int,Assimp::SharedPostProcessInfo::Base*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                  *)this,&local_50);
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>
               ::operator*(&local_38);
      if (ppVar3->second != (Base *)bWasExisting_local) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>
                 ::operator*(&local_38);
        if (ppVar3->second != (Base *)0x0) {
          (*ppVar3->second->_vptr_Base[1])();
        }
        pbVar1 = bWasExisting_local;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>
                 ::operator*(&local_38);
        ppVar3->second = (Base *)pbVar1;
      }
      if (bWasExisting_local == (bool *)0x0) {
        std::
        map<unsigned_int,Assimp::SharedPostProcessInfo::Base*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
        ::erase_abi_cxx11_((map<unsigned_int,Assimp::SharedPostProcessInfo::Base*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                            *)szName_local,(iterator)local_38._M_node);
      }
      if (bWasExisting != (bool *)0x0) {
        *bWasExisting = true;
      }
    }
    return;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                ,0x5d,
                "void SetGenericPropertyPtr(std::map<unsigned int, T *> &, const char *, T *, bool *) [T = Assimp::SharedPostProcessInfo::Base]"
               );
}

Assistant:

inline
void SetGenericPropertyPtr(std::map< unsigned int, T* >& list,
        const char* szName, T* value, bool* bWasExisting = nullptr ) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T*>::iterator it = list.find(hash);
    if (it == list.end())   {
        if (bWasExisting) {
            *bWasExisting = false;
        }

        list.insert(std::pair<unsigned int,T*>( hash, value ));
        return;
    }
    if ((*it).second != value)  {
        delete (*it).second;
        (*it).second = value;
    }
    if (!value) {
        list.erase(it);
    }
    if (bWasExisting) {
        *bWasExisting = true;
    }
}